

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
fmt::v9::
sprintf<char[45],short,char*,char_const*,char_const*,char_const*,char_const*,char_const*,char*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char*,char_const*,char_const*,char>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,v9 *this,char (*fmt) [45],short *args,char **args_1,char **args_2,char **args_3,
          char **args_4,char **args_5,char **args_6,char **args_7,char **args_8,char **args_9,
          char **args_10,char **args_11,char **args_12,char **args_13,char **args_14,char **args_15,
          char **args_16)

{
  size_t sVar1;
  basic_string_view<char> format;
  basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> args_17;
  buffer<char> local_470;
  char local_450 [504];
  ulong local_258 [2];
  undefined4 local_248;
  undefined8 local_238;
  undefined4 local_228;
  char *local_218;
  undefined4 local_208;
  char *local_1f8;
  undefined4 local_1e8;
  char *local_1d8;
  undefined4 local_1c8;
  char *local_1b8;
  undefined4 local_1a8;
  char *local_198;
  undefined4 local_188;
  char *local_178;
  undefined4 local_168;
  char *local_158;
  undefined4 local_148;
  char *local_138;
  undefined4 local_128;
  char *local_118;
  undefined4 local_108;
  char *local_f8;
  undefined4 local_e8;
  char *local_d8;
  undefined4 local_c8;
  char *local_b8;
  undefined4 local_a8;
  char *local_98;
  undefined4 local_88;
  char *local_78;
  undefined4 local_68;
  char *local_58;
  undefined4 local_48;
  
  sVar1 = strlen((char *)this);
  local_258[0] = (ulong)(uint)(int)*(short *)*fmt;
  local_238 = *(undefined8 *)args;
  local_218 = *args_1;
  local_1f8 = *args_2;
  local_1d8 = *args_3;
  local_1b8 = *args_4;
  local_198 = *args_5;
  local_178 = *args_6;
  local_158 = *args_7;
  local_138 = *args_8;
  local_118 = *args_9;
  local_f8 = *args_10;
  local_d8 = *args_11;
  local_b8 = *args_12;
  local_98 = *args_13;
  local_78 = *args_14;
  local_58 = *args_15;
  local_248 = 1;
  local_228 = 0xc;
  local_208 = 0xc;
  local_1e8 = 0xc;
  local_1c8 = 0xc;
  local_1a8 = 0xc;
  local_188 = 0xc;
  local_168 = 0xc;
  local_148 = 0xc;
  local_128 = 0xc;
  local_108 = 0xc;
  local_e8 = 0xc;
  local_c8 = 0xc;
  local_a8 = 0xc;
  local_88 = 0xc;
  local_68 = 0xc;
  local_48 = 0xc;
  local_470.size_ = 0;
  local_470._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
  local_470.capacity_ = 500;
  format.size_ = sVar1;
  format.data_ = (char *)this;
  args_17.field_1.values_ =
       (value<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *)local_258;
  args_17.desc_ = 0x8000000000000011;
  local_470.ptr_ = local_450;
  detail::vprintf<char,fmt::v9::basic_printf_context<fmt::v9::appender,char>>
            (&local_470,format,args_17);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_470.ptr_,local_470.ptr_ + local_470.size_);
  if (local_470.ptr_ != local_450) {
    operator_delete(local_470.ptr_,local_470.capacity_);
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto sprintf(const S& fmt, const T&... args) -> std::basic_string<Char> {
  using context = basic_printf_context_t<Char>;
  return vsprintf(detail::to_string_view(fmt),
                  fmt::make_format_args<context>(args...));
}